

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O3

size_t HUF_compress1X_usingCTable_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable,int bmi2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  BYTE *ip;
  ulong uVar8;
  ulong *puVar9;
  int iVar10;
  BYTE *ostart;
  uint uVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  
  if (dstSize < 8) {
    return 0;
  }
  uVar14 = 0;
  uVar6 = 0;
  if (dstSize == 8) {
    return 0;
  }
  puVar12 = (ulong *)((long)dst + (dstSize - 8));
  uVar13 = srcSize & 0xfffffffffffffffc;
  uVar11 = (uint)srcSize & 3;
  uVar8 = (ulong)uVar11;
  switch(uVar11) {
  case 0:
    puVar9 = (ulong *)dst;
    goto joined_r0x00491d93;
  case 1:
    uVar8 = 0;
    goto LAB_00491d56;
  case 2:
    uVar8 = 0;
    break;
  case 3:
    bVar1 = *(byte *)((long)src + uVar13 + 2);
    uVar8 = (ulong)CTable[bVar1].val;
    uVar6 = (uint)CTable[bVar1].nbBits;
  }
  bVar1 = *(byte *)((long)src + uVar13 + 1);
  uVar8 = (ulong)CTable[bVar1].val << ((byte)uVar6 & 0x3f) | uVar8;
  uVar6 = CTable[bVar1].nbBits + uVar6;
LAB_00491d56:
  uVar8 = (ulong)CTable[*(byte *)((long)src + uVar13)].val << ((byte)uVar6 & 0x3f) | uVar8;
  uVar6 = CTable[*(byte *)((long)src + uVar13)].nbBits + uVar6;
  puVar9 = (ulong *)((ulong)(uVar6 >> 3) + (long)dst);
  if (puVar12 < puVar9) {
    puVar9 = puVar12;
  }
  *(ulong *)dst = uVar8;
  uVar14 = (ulong)(uVar6 & 7);
  uVar8 = uVar8 >> ((byte)uVar6 & 0x38);
joined_r0x00491d93:
  for (; uVar13 != 0; uVar13 = uVar13 - 4) {
    bVar1 = *(byte *)((long)src + (uVar13 - 1));
    iVar10 = (uint)CTable[bVar1].nbBits + (int)uVar14;
    bVar2 = *(byte *)((long)src + (uVar13 - 2));
    iVar7 = (uint)CTable[bVar2].nbBits + iVar10;
    bVar3 = *(byte *)((long)src + (uVar13 - 3));
    iVar5 = (uint)CTable[bVar3].nbBits + iVar7;
    bVar4 = *(byte *)((long)src + (uVar13 - 4));
    uVar14 = (ulong)CTable[bVar4].val << ((byte)iVar5 & 0x3f) |
             (ulong)CTable[bVar3].val << ((byte)iVar7 & 0x3f) |
             (ulong)CTable[bVar2].val << ((byte)iVar10 & 0x3f) |
             (ulong)CTable[bVar1].val << (sbyte)uVar14 | uVar8;
    uVar6 = (uint)CTable[bVar4].nbBits + iVar5;
    puVar15 = (ulong *)((ulong)(uVar6 >> 3) + (long)puVar9);
    if (puVar12 < puVar15) {
      puVar15 = puVar12;
    }
    uVar8 = uVar14 >> ((byte)uVar6 & 0x38);
    *puVar9 = uVar14;
    uVar14 = (ulong)(uVar6 & 7);
    puVar9 = puVar15;
  }
  uVar6 = (int)uVar14 + 1;
  *puVar9 = uVar8 | 1L << uVar14;
  puVar9 = (ulong *)((ulong)(uVar6 >> 3) + (long)puVar9);
  if (puVar12 < puVar9) {
    puVar9 = puVar12;
  }
  if (puVar12 <= puVar9) {
    return 0;
  }
  return (long)puVar9 - ((long)dst + ((ulong)((uVar6 & 7) == 0) - 1));
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_compress1X_usingCTable_internal_body(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    const BYTE* ip = (const BYTE*) src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;
    size_t n;
    BIT_CStream_t bitC;

    /* init */
    if (dstSize < 8) return 0;   /* not enough space to compress */
    { size_t const initErr = BIT_initCStream(&bitC, op, oend-op);
      if (HUF_isError(initErr)) return 0; }

    n = srcSize & ~3;  /* join to mod 4 */
    switch (srcSize & 3)
    {
        case 3 : HUF_encodeSymbol(&bitC, ip[n+ 2], CTable);
                 HUF_FLUSHBITS_2(&bitC);
		 /* fall-through */
        case 2 : HUF_encodeSymbol(&bitC, ip[n+ 1], CTable);
                 HUF_FLUSHBITS_1(&bitC);
		 /* fall-through */
        case 1 : HUF_encodeSymbol(&bitC, ip[n+ 0], CTable);
                 HUF_FLUSHBITS(&bitC);
		 /* fall-through */
        case 0 : /* fall-through */
        default: break;
    }

    for (; n>0; n-=4) {  /* note : n&3==0 at this stage */
        HUF_encodeSymbol(&bitC, ip[n- 1], CTable);
        HUF_FLUSHBITS_1(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 2], CTable);
        HUF_FLUSHBITS_2(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 3], CTable);
        HUF_FLUSHBITS_1(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 4], CTable);
        HUF_FLUSHBITS(&bitC);
    }

    return BIT_closeCStream(&bitC);
}